

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  ImGuiDockNode *this;
  ImGuiDockNode *pIVar1;
  int local_34;
  int child_n;
  ImGuiDockNode *dst_node;
  ImGuiContext_conflict *ctx;
  ImVector<unsigned_int> *out_node_remap_pairs_local;
  ImGuiID dst_node_id_if_known_local;
  ImGuiDockNode *src_node_local;
  
  this = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  this->SharedFlags = src_node->SharedFlags;
  this->LocalFlags = src_node->LocalFlags;
  this->LocalFlagsInWindows = 0;
  this->Pos = src_node->Pos;
  this->Size = src_node->Size;
  this->SizeRef = src_node->SizeRef;
  this->SplitAxis = src_node->SplitAxis;
  ImGuiDockNode::UpdateMergedFlags(this);
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&src_node->ID);
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&this->ID);
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    if (src_node->ChildNodes[local_34] != (ImGuiDockNode *)0x0) {
      pIVar1 = DockBuilderCopyNodeRec(src_node->ChildNodes[local_34],0,out_node_remap_pairs);
      this->ChildNodes[local_34] = pIVar1;
      this->ChildNodes[local_34]->ParentNode = this;
    }
  }
  return this;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->UpdateMergedFlags();

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}